

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# experiments.cpp
# Opt level: O2

void test(uint original_count,uint recovery_count,uint seed)

{
  ushort *puVar1;
  ffe_t *__src;
  uint size;
  size_t __n;
  ffe_t fVar2;
  uint i_1;
  uint uVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  ffe_t *pfVar7;
  uint i_2;
  ulong uVar8;
  uint i;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ffe_t codeword [65536];
  bool erasure [65536];
  ffe_t data [65536];
  fwht_t afStack_20038 [65540];
  
  pfVar7 = (ffe_t *)0x2;
  uVar8 = 2L << ((byte)LZCOUNT(recovery_count - 1) ^ 0x1f);
  size = (uint)uVar8;
  uVar6 = (ulong)(size + original_count);
  uVar3 = LZCOUNT((size - 1) + original_count) ^ 0x1f;
  srand(seed);
  memset(data,0,0x20000);
  uVar9 = uVar8 & 0xffffffff;
  for (uVar11 = uVar9; uVar11 < uVar6; uVar11 = uVar11 + 1) {
    iVar4 = rand();
    data[uVar11] = (ffe_t)iVar4;
  }
  memset(codeword,0,0x20000);
  __src = data + (size & 0xfffffffe);
  __n = (ulong)(size & 0xfffffffe) * 2;
  memcpy(data,__src,__n);
  IFLT(data,size,size);
  uVar11 = uVar8 & 0xffffffff;
  while( true ) {
    if (original_count <= (uint)uVar11) break;
    pfVar7 = __src;
    memcpy(codeword,__src + uVar11,__n);
    uVar10 = (uint)uVar11 + size;
    uVar11 = (ulong)uVar10;
    IFLT(codeword,size,uVar10);
    for (lVar5 = 0; (uVar8 >> 1 & 0x7fffffff) << 2 != lVar5; lVar5 = lVar5 + 2) {
      pfVar7 = (ffe_t *)(ulong)*(ushort *)((long)codeword + lVar5);
      *(ushort *)((long)data + lVar5) =
           *(ushort *)((long)data + lVar5) ^ *(ushort *)((long)codeword + lVar5);
    }
  }
  FLT(data,size,size,(uint)pfVar7);
  memcpy(codeword,data,0x20000);
  uVar10 = 0;
  memset(erasure,0,0x10000);
  for (; uVar9 < recovery_count + size; uVar9 = uVar9 + 1) {
    erasure[uVar9] = true;
  }
  for (lVar5 = 0; lVar5 != 0x10000; lVar5 = lVar5 + 1) {
    afStack_20038[lVar5] = (ushort)erasure[lVar5];
  }
  FWHT(afStack_20038,uVar10);
  for (lVar5 = 0; lVar5 != 0x20000; lVar5 = lVar5 + 2) {
    *(short *)((long)afStack_20038 + lVar5) =
         (short)((ulong)((uint)*(ushort *)((long)log_walsh + lVar5) *
                        (uint)*(ushort *)((long)afStack_20038 + lVar5)) % 0xffff);
  }
  FWHT(afStack_20038,0x164090);
  for (uVar11 = 0; uVar6 != uVar11; uVar11 = uVar11 + 1) {
    if (erasure[uVar11] == false) {
      fVar2 = mulE(codeword[uVar11],afStack_20038[uVar11]);
    }
    else {
      fVar2 = 0;
    }
    codeword[uVar11] = fVar2;
  }
  uVar11 = (ulong)uVar3;
  uVar3 = 2 << (uVar3 & 0x1f);
  for (; uVar6 < uVar3; uVar6 = uVar6 + 1) {
    codeword[uVar6] = 0;
  }
  IFLT(codeword,uVar3,0);
  for (uVar6 = 1; uVar6 < uVar3; uVar6 = uVar6 + 1) {
    uVar10 = (uint)uVar6;
    uVar8 = uVar6 & 0xffffffff;
    for (uVar11 = (ulong)(uVar10 - ((uVar10 - 1 ^ uVar10) + 1 >> 1)); uVar11 < uVar6;
        uVar11 = uVar11 + 1) {
      puVar1 = codeword + uVar8;
      uVar8 = (ulong)((int)uVar8 + 1);
      codeword[uVar11] = codeword[uVar11] ^ *puVar1;
    }
  }
  FLT(codeword,uVar3,size + original_count,(uint)uVar11);
  for (lVar5 = 0; lVar5 != 0x10000; lVar5 = lVar5 + 1) {
    if (erasure[lVar5] == true) {
      fVar2 = mulE(codeword[lVar5],afStack_20038[lVar5] ^ 0xffff);
      codeword[lVar5] = fVar2;
    }
  }
  lVar5 = 0;
  while( true ) {
    if (lVar5 == 0x10000) {
      printf(":D ");
      return;
    }
    if ((erasure[lVar5] == true) && (data[lVar5] != codeword[lVar5])) break;
    lVar5 = lVar5 + 1;
  }
  printf("Decoding Error with seed = %d!\n",(ulong)seed);
  return;
}

Assistant:

void test(unsigned original_count, unsigned recovery_count, unsigned seed)
{
    unsigned m = 2UL << LastNonzeroBit64(recovery_count - 1);
    unsigned n = 2UL << LastNonzeroBit64(m + original_count - 1);

    srand(seed);

    //-----------Generating message----------

    // Message array
    ffe_t data[kFieldSize] = {0};

    // Filled with random numbers
    for (unsigned i = m; i < m + original_count; ++i)
        data[i] = (ffe_t)rand();


    //---------encoding----------

    ffe_t codeword[kFieldSize] = {};
    // First m codewords are for the parity data
    encodeH(data + m, m, original_count, data, codeword);
    //encodeL(data, k, codeword); // does not seem to work with any input?  what else needs to change?

    memcpy(codeword, data, sizeof(ffe_t) * kFieldSize);


    //--------erasure simulation---------

    // Array indicating erasures
    bool erasure[kFieldSize] = {
        false
    };

    // Tag the first "recovery_count" elements as erasures
    for (unsigned i = m; i < m + recovery_count; ++i)
        erasure[i] = true;

#if 0
    // permuting the erasure array
    for (unsigned i = m + original_count - 1; i > 0; --i)
    {
        unsigned pos = rand() % (i + 1);

        if (i != pos)
        {
            bool tmp = erasure[i];
            erasure[i] = erasure[pos];
            erasure[pos] = tmp;
        }
    }
#endif


    //---------main processing----------
    decode(codeword, m, original_count, n, erasure);

    // Check the correctness of the result
    for (unsigned i = 0; i < kFieldSize; ++i)
    {
        if (erasure[i])
        {
            if (data[i] != codeword[i])
            {
                printf("Decoding Error with seed = %d!\n", seed);
                LEO_DEBUG_BREAK;
                return;
            }
        }
    }

    printf(":D ");
}